

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

ssize_t MAFSA_automaton_search
                  (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *out,size_t sz_out,
                  size_t *sz_out_result)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (sz_l != 0) {
    uVar1 = *ma->ptr_nodes;
    uVar8 = 0;
    do {
      uVar7 = uVar8 & 0xffffffff;
      uVar6 = uVar1;
      if (uVar7 < sz_l && -1 < (int)uVar1) {
        uVar5 = uVar8 & 0xffffffff;
        while( true ) {
          uVar3 = ma->ptr_links[uVar6];
          if (uVar3 == 0xff000000) goto LAB_0010683f;
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
          uVar2 = uVar6;
          while( true ) {
            uVar2 = uVar2 + 1;
            if (l[uVar7] == (MAFSA_letter)(uVar3 >> 0x18)) break;
            uVar3 = ma->ptr_links[uVar2];
            if (uVar3 == 0xff000000) goto LAB_0010683a;
          }
          if ((uVar3 & 0xffffff) == 0) break;
          uVar6 = ma->ptr_nodes[uVar3 & 0xffffff];
          uVar7 = (ulong)uVar4;
          if ((sz_l <= uVar7) || ((int)uVar6 < 0)) break;
        }
      }
      else {
        uVar4 = (uint)uVar8;
      }
LAB_0010683a:
      if ((int)uVar6 < 0) {
        uVar7 = uVar4 - uVar8;
        if (sz_out <= uVar4 - uVar8) {
          uVar7 = sz_out;
        }
        memcpy(out,l + uVar8,uVar7);
        if (sz_out_result == (size_t *)0x0) {
          return uVar8;
        }
        *sz_out_result = uVar7;
        return uVar8;
      }
LAB_0010683f:
      uVar8 = uVar8 + 1;
    } while (uVar8 != sz_l);
  }
  return -1;
}

Assistant:

extern ssize_t MAFSA_automaton_search(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l,
    MAFSA_letter *out, size_t sz_out, size_t *sz_out_result)
{
    ssize_t cur_pos;

    for (cur_pos = 0; cur_pos < sz_l; cur_pos++)
    {
        uint32_t i = cur_pos;
        uint32_t current = ma->ptr_nodes[0];
        uint32_t where = 0;

        while (i < sz_l && !node_is_final(current))
        {
            MAFSA_letter label = l[i++];

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
            {
                current = ma->ptr_nodes[where];
            }
            else
            {
                break;
            }
        }

        if (node_is_final(current))
        {
            ssize_t cpy_sz;
            
            cpy_sz = i - cur_pos < sz_out ? i - cur_pos : sz_out;
            memcpy(out, l + cur_pos, cpy_sz);

            if (sz_out_result)
            {
                *sz_out_result = cpy_sz;
            }

            return cur_pos;
        }
    }

    return -1;
}